

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void Am_Choice_List_Outside_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *param_3,Am_Input_Event *param_4)

{
  Am_Object local_50;
  Am_Input_Char local_48;
  Am_Object local_38;
  Am_Object local_30;
  Am_Input_Event *local_28;
  Am_Input_Event *param_3_local;
  Am_Object *param_2_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  local_28 = param_4;
  param_3_local = (Am_Input_Event *)param_3;
  param_2_local = object;
  object_local = inter;
  Am_Object::Am_Object(&local_30,inter);
  Am_Object::Am_Object(&local_38,param_2_local);
  local_48 = Am_Default_Stop_Char;
  Am_Object::Am_Object(&local_50,&Am_No_Object);
  Am_Stop_Interactor(&local_30,&local_38,local_48,&local_50,0,0,true);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void,
                 Am_Choice_List_Outside_Stop_Method,
                 (Am_Object & inter, Am_Object &object,
                  Am_Object & /* event_window */, Am_Input_Event * /* ev */))
{
  Am_INTER_TRACE_PRINT(inter, "Choice List outside STOP");
  Am_Stop_Interactor(inter, object);
}